

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerLdEnv(Lowerer *this,Instr *instr)

{
  Var pvVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  Instr *pIVar5;
  Opnd *pOVar6;
  undefined4 *puVar7;
  RegOpnd *baseOpnd;
  IndirOpnd *newSrc;
  AddrOpnd *pAVar8;
  MemRefOpnd *newSrc_00;
  MemRefOpnd *functionEnvMemRefOpnd;
  AddrOpnd *functionObjAddrOpnd;
  IndirOpnd *indirOpnd;
  Instr *instrPrev;
  Opnd *functionObjOpnd;
  Opnd *src1;
  Instr *instr_local;
  Lowerer *this_local;
  
  src1 = (Opnd *)instr;
  instr_local = (Instr *)this;
  functionObjOpnd = IR::Instr::GetSrc1(instr);
  pIVar5 = LowererMD::LoadFunctionObjectOpnd(&this->m_lowererMD,(Instr *)src1,(Opnd **)&instrPrev);
  pOVar6 = IR::Instr::GetSrc1((Instr *)src1);
  if (pOVar6 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f54,"(!instr->GetSrc1())","!instr->GetSrc1()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (functionObjOpnd != (Opnd *)0x0) {
    bVar3 = IR::Opnd::IsRegOpnd((Opnd *)instrPrev);
    if (!bVar3) {
      bVar3 = IR::Opnd::IsAddrOpnd((Opnd *)instrPrev);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x6f5d,"(functionObjOpnd->IsAddrOpnd())","functionObjOpnd->IsAddrOpnd()"
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pAVar8 = IR::Opnd::AsAddrOpnd((Opnd *)instrPrev);
      pvVar1 = pAVar8->m_address;
      uVar4 = Js::ScriptFunction::GetOffsetOfEnvironment();
      newSrc_00 = IR::MemRefOpnd::New((void *)((long)pvVar1 + (ulong)uVar4),TyUint64,this->m_func,
                                      AddrOpndKindDynamicFunctionEnvironmentRef);
      IR::Instr::SetSrc1((Instr *)src1,&newSrc_00->super_Opnd);
      goto LAB_007adc3e;
    }
  }
  baseOpnd = IR::Opnd::AsRegOpnd((Opnd *)instrPrev);
  uVar4 = Js::ScriptFunction::GetOffsetOfEnvironment();
  newSrc = IR::IndirOpnd::New(baseOpnd,uVar4,TyUint64,this->m_func,false);
  IR::Instr::SetSrc1((Instr *)src1,&newSrc->super_Opnd);
LAB_007adc3e:
  LowererMD::ChangeToAssign((Instr *)src1);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerLdEnv(IR::Instr * instr)
{
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * functionObjOpnd;
    IR::Instr * instrPrev = this->m_lowererMD.LoadFunctionObjectOpnd(instr, functionObjOpnd);
    Assert(!instr->GetSrc1());
    if (src1 == nullptr || functionObjOpnd->IsRegOpnd())
    {
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(),
            Js::ScriptFunction::GetOffsetOfEnvironment(), TyMachPtr, m_func);
        instr->SetSrc1(indirOpnd);
    }
    else
    {
        Assert(functionObjOpnd->IsAddrOpnd());
        IR::AddrOpnd* functionObjAddrOpnd = functionObjOpnd->AsAddrOpnd();
        IR::MemRefOpnd* functionEnvMemRefOpnd = IR::MemRefOpnd::New((void *)((intptr_t)functionObjAddrOpnd->m_address + Js::ScriptFunction::GetOffsetOfEnvironment()),
            TyMachPtr, this->m_func, IR::AddrOpndKindDynamicFunctionEnvironmentRef);
        instr->SetSrc1(functionEnvMemRefOpnd);
    }

    LowererMD::ChangeToAssign(instr);
    return instrPrev;
}